

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

string * to_hexstring_abi_cxx11_(string *__return_storage_ptr__,BN *bn)

{
  ostream *poVar1;
  pointer puVar2;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_210;
  string group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  BN::raw((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_210,bn);
  for (puVar2 = local_210._M_impl.super__Vector_impl_data._M_finish;
      puVar2 != local_210._M_impl.super__Vector_impl_data._M_start; puVar2 = puVar2 + -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::operator<<(local_1a8,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 4;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    std::operator+(&local_1d8,__return_storage_ptr__,&group);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&group);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_210);
  return __return_storage_ptr__;
}

Assistant:

string to_hexstring(const BN& bn) {
    // TODO: make tests
    string result;

    const auto& raw = bn.raw();
    for (auto i = raw.rbegin(); i != raw.rend(); ++i) {
        stringstream stream;
        stream << hex << setfill('0') << setw(bz * 2) << static_cast<uint32_t>(*i);
        string group = stream.str();
        result = result + group;
    }
    return result;
}